

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O0

Req adios2::helper::CommImpl::MakeReq
              (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
               *impl)

{
  __uniq_ptr_impl<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  in_RDI;
  unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
  *in_stack_ffffffffffffffb8;
  
  std::unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>::
  unique_ptr((unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
              *)in_RDI._M_t.
                super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
                .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl,
             in_stack_ffffffffffffffb8);
  Comm::Req::Req((Req *)in_RDI._M_t.
                        super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
                        .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl,
                 in_stack_ffffffffffffffb8);
  std::unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>::
  ~unique_ptr((unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
               *)in_RDI._M_t.
                 super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
                 .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl);
  return (unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
         )(unique_ptr<adios2::helper::CommReqImpl,_std::default_delete<adios2::helper::CommReqImpl>_>
           )in_RDI._M_t.
            super__Tuple_impl<0UL,_adios2::helper::CommReqImpl_*,_std::default_delete<adios2::helper::CommReqImpl>_>
            .super__Head_base<0UL,_adios2::helper::CommReqImpl_*,_false>._M_head_impl;
}

Assistant:

Comm::Req CommImpl::MakeReq(std::unique_ptr<CommReqImpl> impl)
{
    return Comm::Req(std::move(impl));
}